

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O2

void __thiscall
QParallelAnimationGroup::updateCurrentTime(QParallelAnimationGroup *this,int currentTime)

{
  QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
  *this_00;
  QParallelAnimationGroupPrivate *this_01;
  QAbstractAnimation **ppQVar1;
  long lVar2;
  QAbstractAnimation *pQVar3;
  bool bVar4;
  parameter_type pVar5;
  int iVar6;
  State SVar7;
  State SVar8;
  long lVar9;
  
  this_01 = *(QParallelAnimationGroupPrivate **)(this + 8);
  if ((this_01->super_QAnimationGroupPrivate).animations.d.size != 0) {
    this_00 = &(this_01->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentLoop;
    pVar5 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
            ::value(this_00);
    if (this_01->lastLoop < pVar5) {
      iVar6 = (**(code **)(*(long *)this + 0x60))();
      if (0 < iVar6) {
        ppQVar1 = (this_01->super_QAnimationGroupPrivate).animations.d.ptr;
        lVar2 = (this_01->super_QAnimationGroupPrivate).animations.d.size;
        for (lVar9 = 0; lVar2 << 3 != lVar9; lVar9 = lVar9 + 8) {
          pQVar3 = *(QAbstractAnimation **)((long)ppQVar1 + lVar9);
          SVar7 = QAbstractAnimation::state(pQVar3);
          if (SVar7 != Stopped) {
            QAbstractAnimation::setCurrentTime(pQVar3,iVar6);
          }
        }
      }
    }
    else {
      pVar5 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
              ::value(this_00);
      if (pVar5 < this_01->lastLoop) {
        ppQVar1 = (this_01->super_QAnimationGroupPrivate).animations.d.ptr;
        lVar2 = (this_01->super_QAnimationGroupPrivate).animations.d.size;
        for (lVar9 = 0; lVar2 << 3 != lVar9; lVar9 = lVar9 + 8) {
          pQVar3 = *(QAbstractAnimation **)((long)ppQVar1 + lVar9);
          QParallelAnimationGroupPrivate::applyGroupState(this_01,(QAbstractAnimation *)pQVar3);
          QAbstractAnimation::setCurrentTime(pQVar3,0);
          QAbstractAnimation::stop(pQVar3);
        }
      }
    }
    ppQVar1 = (this_01->super_QAnimationGroupPrivate).animations.d.ptr;
    lVar2 = (this_01->super_QAnimationGroupPrivate).animations.d.size;
    for (lVar9 = 0; lVar2 << 3 != lVar9; lVar9 = lVar9 + 8) {
      pQVar3 = *(QAbstractAnimation **)((long)ppQVar1 + lVar9);
      iVar6 = QAbstractAnimation::totalDuration(pQVar3);
      pVar5 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
              ::value(this_00);
      if (this_01->lastLoop < pVar5) {
LAB_00366258:
        QParallelAnimationGroupPrivate::applyGroupState(this_01,(QAbstractAnimation *)pQVar3);
      }
      else {
        bVar4 = QParallelAnimationGroupPrivate::shouldAnimationStart
                          (this_01,(QAbstractAnimation *)pQVar3,iVar6 < this_01->lastCurrentTime);
        if (bVar4) goto LAB_00366258;
      }
      SVar7 = QAbstractAnimation::state(pQVar3);
      SVar8 = QAbstractAnimation::state((QAbstractAnimation *)this);
      if (SVar7 == SVar8) {
        QAbstractAnimation::setCurrentTime(pQVar3,currentTime);
        if (iVar6 < currentTime && 0 < iVar6) {
          QAbstractAnimation::stop(pQVar3);
        }
      }
    }
    pVar5 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
            ::value(this_00);
    this_01->lastLoop = pVar5;
    this_01->lastCurrentTime = currentTime;
  }
  return;
}

Assistant:

void QParallelAnimationGroup::updateCurrentTime(int currentTime)
{
    Q_D(QParallelAnimationGroup);
    if (d->animations.isEmpty())
        return;

    if (d->currentLoop > d->lastLoop) {
        // simulate completion of the loop
        int dura = duration();
        if (dura > 0) {
            for (AnimationListConstIt it = d->animations.constBegin(), cend = d->animations.constEnd(); it != cend; ++it) {
                QAbstractAnimation *animation = (*it);
                if (animation->state() != QAbstractAnimation::Stopped)
                    animation->setCurrentTime(dura);   // will stop
            }
        }
    } else if (d->currentLoop < d->lastLoop) {
        // simulate completion of the loop seeking backwards
        for (AnimationListConstIt it = d->animations.constBegin(), cend = d->animations.constEnd(); it != cend; ++it) {
            QAbstractAnimation *animation = *it;
            //we need to make sure the animation is in the right state
            //and then rewind it
            d->applyGroupState(animation);
            animation->setCurrentTime(0);
            animation->stop();
        }
    }

#ifdef QANIMATION_DEBUG
    qDebug("QParallellAnimationGroup %5d: setCurrentTime(%d), loop:%d, last:%d, timeFwd:%d, lastcurrent:%d, %d",
        __LINE__, d->currentTime, d->currentLoop, d->lastLoop, timeFwd, d->lastCurrentTime, state());
#endif
    // finally move into the actual time of the current loop
    for (AnimationListConstIt it = d->animations.constBegin(), cend = d->animations.constEnd(); it != cend; ++it) {
        QAbstractAnimation *animation = *it;
        const int dura = animation->totalDuration();
        //if the loopcount is bigger we should always start all animations
        if (d->currentLoop > d->lastLoop
            //if we're at the end of the animation, we need to start it if it wasn't already started in this loop
            //this happens in Backward direction where not all animations are started at the same time
            || d->shouldAnimationStart(animation, d->lastCurrentTime > dura /*startIfAtEnd*/)) {
            d->applyGroupState(animation);
        }

        if (animation->state() == state()) {
            animation->setCurrentTime(currentTime);
            if (dura > 0 && currentTime > dura)
                animation->stop();
        }
    }
    d->lastLoop = d->currentLoop;
    d->lastCurrentTime = currentTime;
}